

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O2

bool senjo::NumberParam<unsigned_long>
               (string *name,unsigned_long *value,char **params,bool *invalid)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  unsigned_long uVar6;
  long lVar7;
  
  bVar1 = ParamMatch(name,params);
  if (!bVar1) {
    return bVar1;
  }
  pcVar3 = *params;
  if (pcVar3 != (char *)0x0) {
    cVar4 = *pcVar3;
    if (cVar4 == '-') {
      *params = pcVar3 + 1;
      cVar4 = pcVar3[1];
      lVar7 = -1;
      pcVar3 = pcVar3 + 1;
    }
    else {
      lVar7 = 1;
    }
    if ((int)cVar4 - 0x30U < 10) {
      *params = pcVar3 + 1;
      lVar5 = (long)*pcVar3;
      pcVar3 = pcVar3 + 1;
      while( true ) {
        uVar6 = lVar5 - 0x30;
        *value = uVar6;
        cVar4 = *pcVar3;
        if (9 < (int)cVar4 - 0x30U) break;
        *params = pcVar3 + 1;
        lVar5 = uVar6 * 10 + (long)*pcVar3;
        pcVar3 = pcVar3 + 1;
      }
      if ((cVar4 == '\0') || (iVar2 = isspace((int)cVar4), iVar2 != 0)) {
        *value = uVar6 * lVar7;
        NextWord(params);
        return bVar1;
      }
    }
  }
  *invalid = true;
  return bVar1;
}

Assistant:

static inline bool NumberParam(const std::string& name, Number& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  int sign = 1;
  if (params && (*params == '-')) {
    sign = -1;
    ++params;
  }
  if (!params || !*params || !isdigit(*params)) {
    invalid = true;
  }
  else {
    value = (*params++ - '0');
    while (*params && isdigit(*params)) {
      value = ((10 * value) + (*params++ - '0'));
    }
    if (*params && !isspace(*params)) {
      invalid = true;
    }
    else {
      value *= sign;
      NextWord(params);
    }
  }
  return true;
}